

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnExport
          (BinaryReaderInterp *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  State *pSVar2;
  ModuleDesc *pMVar3;
  Result RVar4;
  long lVar5;
  _func_int **pp_Var6;
  pointer pTVar7;
  pointer pFVar8;
  _func_int ***ppp_Var9;
  Location loc;
  Location loc_1;
  ExportDesc local_e8;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  Location local_98;
  Var local_78;
  
  local_e8.type.name.field_2._8_4_ = 0;
  local_e8.type.name._M_dataplus._M_p = (pointer)(this->filename_)._M_len;
  local_e8.type.name._M_string_length = (size_type)(this->filename_)._M_str;
  pSVar2 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
  local_e8.type.name.field_2._M_allocated_capacity = pSVar2->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar2->offset;
  Var::Var(&local_78,item_index,&local_98);
  RVar4 = SharedValidator::OnExport(&this->validator_,(Location *)&local_e8,kind,&local_78,name);
  Var::~Var(&local_78);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  switch(kind) {
  case First:
    pFVar8 = (this->func_types_).
             super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = (ulong)item_index << 6;
    goto LAB_001a9ff6;
  case Table:
    pFVar8 = (pointer)(this->table_types_).
                      super__Vector_base<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    break;
  case Memory:
    pFVar8 = (pointer)(this->memory_types_).
                      super__Vector_base<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    break;
  case Global:
    pTVar7 = (pointer)(this->global_types_).
                      super__Vector_base<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (ulong)item_index * 3;
    goto LAB_001a9fd8;
  case Last:
    pTVar7 = (this->tag_types_).
             super__Vector_base<wabt::interp::TagType,_std::allocator<wabt::interp::TagType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = (ulong)item_index * 5;
LAB_001a9fd8:
    ppp_Var9 = &(pTVar7->super_ExternType)._vptr_ExternType + lVar5;
    pp_Var6 = *ppp_Var9;
    goto LAB_001a9ffe;
  default:
    local_e8.type.type._M_t.
    super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
    _M_t.
    super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
    .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
            )(ExternType *)0x0;
    goto LAB_001aa00c;
  }
  lVar5 = (ulong)item_index * 0x30;
LAB_001a9ff6:
  ppp_Var9 = (_func_int ***)((long)&(pFVar8->super_ExternType)._vptr_ExternType + lVar5);
  pp_Var6 = *(_func_int ***)((long)&(pFVar8->super_ExternType)._vptr_ExternType + lVar5);
LAB_001a9ffe:
  (*pp_Var6[2])(&local_e8,ppp_Var9);
  local_e8.type.type._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
        )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )local_e8.type.name._M_dataplus._M_p;
LAB_001aa00c:
  pMVar3 = this->module_;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,name._M_str,name._M_str + name._M_len);
  paVar1 = &local_e8.type.name.field_2;
  local_e8.type.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_b8,local_b0 + (long)local_b8);
  local_e8.index = item_index;
  std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::
  emplace_back<wabt::interp::ExportDesc>(&pMVar3->exports,&local_e8);
  if ((_Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>)
      local_e8.type.type._M_t.
      super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
      ._M_t.
      super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
      .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl != (ExternType *)0x0) {
    (**(code **)(*(long *)local_e8.type.type._M_t.
                          super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                          .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl + 8
                ))();
  }
  local_e8.type.type._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
        )(__uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>)
         0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.type.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.type.name._M_dataplus._M_p,
                    local_e8.type.name.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderInterp::OnExport(Index index,
                                    ExternalKind kind,
                                    Index item_index,
                                    std::string_view name) {
  CHECK_RESULT(validator_.OnExport(GetLocation(), kind,
                                   Var(item_index, GetLocation()), name));

  std::unique_ptr<ExternType> type;
  switch (kind) {
    case ExternalKind::Func:   type = func_types_[item_index].Clone(); break;
    case ExternalKind::Table:  type = table_types_[item_index].Clone(); break;
    case ExternalKind::Memory: type = memory_types_[item_index].Clone(); break;
    case ExternalKind::Global: type = global_types_[item_index].Clone(); break;
    case ExternalKind::Tag:    type = tag_types_[item_index].Clone(); break;
  }
  module_.exports.push_back(
      ExportDesc{ExportType(std::string(name), std::move(type)), item_index});
  return Result::Ok;
}